

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

void __thiscall
PosixRunWriter::write_raw(PosixRunWriter *this,FileId base,uint8_t *start,uint8_t *end)

{
  iterator __position;
  uint uVar1;
  pointer puVar2;
  ulong __n;
  uint8_t *puVar3;
  long lVar4;
  byte bVar5;
  byte *__args;
  
  if (end != start) {
    bVar5 = *start;
    __n = (ulong)bVar5;
    uVar1 = bVar5 & 0x7f;
    puVar3 = start;
    if ((char)bVar5 < '\0') {
      __n = 7;
      do {
        bVar5 = puVar3[1];
        start = (uint8_t *)(ulong)bVar5;
        puVar3 = puVar3 + 1;
        uVar1 = uVar1 + ((bVar5 & 0x7f) << ((byte)__n & 0x1f));
        __n = (ulong)((int)__n + 7);
      } while ((char)bVar5 < '\0');
    }
    write(this,uVar1 + base,start,__n);
    __args = puVar3 + 1;
    if (__args < end) {
      puVar3 = end + ~(ulong)puVar3;
      bVar5 = 0;
      lVar4 = 0;
      do {
        this->out_bytes_ = this->out_bytes_ + 1;
        __position._M_current =
             (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->buffer_,
                     __position,__args);
          puVar2 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          *__position._M_current = *__args;
          puVar2 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
          (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar2;
        }
        if (0x8000000 <
            (ulong)((long)puVar2 -
                   (long)(this->buffer_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
          flush(this);
        }
        lVar4 = lVar4 + (ulong)((*__args & 0x7f) << (bVar5 & 0x1f));
        if ((char)*__args < '\0') {
          bVar5 = bVar5 + 7;
        }
        else {
          this->prev_ = this->prev_ + lVar4 + 1;
          lVar4 = 0;
          bVar5 = 0;
        }
        __args = __args + 1;
        puVar3 = puVar3 + -1;
      } while (puVar3 != (uint8_t *)0x0);
    }
  }
  return;
}

Assistant:

void PosixRunWriter::write_raw(FileId base, uint8_t *start,
                               const uint8_t *end) {
    // Special case: when the range is empty, do nothing.
    if (end == start) {
        return;
    }
    // Decompress the first element and write it.
    uint64_t next = decompress_single(&start);
    write(base + next);

    // Write all the other bytes unchanged, and compute the new last element.
    uint64_t acc = 0;
    uint32_t shift = 0;
    for (const uint8_t *ptr = start; ptr < end; ++ptr) {
        out_bytes_++;
        buffer_.push_back(*ptr);
        if (buffer_.size() > RUN_BUFFER_SIZE) {
            flush();
        }
        acc += (*ptr & 0x7FU) << shift;
        shift += 7U;
        if ((*ptr & 0x80U) == 0) {
            prev_ += acc + 1;
            acc = 0;
            shift = 0;
        }
    }
}